

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingBuffer::free(QRingBuffer *this,void *__ptr)

{
  bool bVar1;
  QRingChunk *pQVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  QRingChunk *chunk;
  qint64 chunkSize;
  QList<QRingChunk> *in_stack_ffffffffffffffe0;
  
  while( true ) {
    if ((long)__ptr < 1) {
      return;
    }
    pQVar2 = QList<QRingChunk>::constFirst(in_stack_ffffffffffffffe0);
    qVar3 = QRingChunk::size(pQVar2);
    qVar4 = QList<QRingChunk>::size(&this->buffers);
    if ((qVar4 == 1) || ((long)__ptr < qVar3)) break;
    this->bufferSize = this->bufferSize - qVar3;
    __ptr = (void *)((long)__ptr - qVar3);
    QList<QRingChunk>::removeFirst(in_stack_ffffffffffffffe0);
  }
  pQVar2 = QList<QRingChunk>::first((QList<QRingChunk> *)0xaaaaaaaaaaaaaaaa);
  if ((QRingBuffer *)this->bufferSize == (QRingBuffer *)__ptr) {
    qVar3 = QRingChunk::capacity((QRingChunk *)0x183155);
    if ((qVar3 <= this->basicBlockSize) &&
       (bVar1 = QRingChunk::isShared((QRingChunk *)0x18316c), !bVar1)) {
      QRingChunk::reset(pQVar2);
      this->bufferSize = 0;
      return;
    }
    clear((QRingBuffer *)__ptr);
    return;
  }
  QRingChunk::advance(pQVar2,(qsizetype)__ptr);
  this->bufferSize = this->bufferSize - (long)__ptr;
  return;
}

Assistant:

void QRingBuffer::free(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qint64 chunkSize = buffers.constFirst().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.first();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.advance(bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeFirst();
    }
}